

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzD::ChNodeFEAxyzD(ChNodeFEAxyzD *this,ChNodeFEAxyzD *other)

{
  ChVariablesGenericDiagonalMass *this_00;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x138);
  *(undefined ***)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x18 =
       &PTR__ChLoadable_011504f8;
  ChNodeFEAxyz::ChNodeFEAxyz
            (&this->super_ChNodeFEAxyz,&PTR_construction_vtable_32__011797a0,
             &other->super_ChNodeFEAxyz);
  (this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase = (_func_int **)0x1179350;
  *(undefined8 *)&this->field_0x138 = 0x11796e0;
  *(undefined8 *)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x18 = 0x1179540;
  (this->super_ChNodeFEAxyz).super_ChVariableTupleCarrier_1vars<3>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x2d8);
  (this->D_dtdt).m_data[2] = 0.0;
  *(undefined8 *)&(this->super_ChNodeFEAxyz).field_0xf0 = 0;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(undefined8 *)&this->field_0x100 = 0;
  (this->D_dt).m_data[0] = 0.0;
  (this->D_dt).m_data[1] = 0.0;
  (this->D_dt).m_data[2] = 0.0;
  (this->D_dtdt).m_data[0] = 0.0;
  (this->D_dtdt).m_data[1] = 0.0;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyz).field_0xe8 = this_00;
  ChVariablesGenericDiagonalMass::operator=
            (this_00,*(ChVariablesGenericDiagonalMass **)&(other->super_ChNodeFEAxyz).field_0xe8);
  if (other != this) {
    *(undefined8 *)&(this->super_ChNodeFEAxyz).field_0xf0 =
         *(undefined8 *)&(other->super_ChNodeFEAxyz).field_0xf0;
    *(undefined8 *)&this->field_0xf8 = *(undefined8 *)&other->field_0xf8;
    *(undefined8 *)&this->field_0x100 = *(undefined8 *)&other->field_0x100;
    (this->D_dt).m_data[0] = (other->D_dt).m_data[0];
    (this->D_dt).m_data[1] = (other->D_dt).m_data[1];
    (this->D_dt).m_data[2] = (other->D_dt).m_data[2];
    (this->D_dtdt).m_data[0] = (other->D_dtdt).m_data[0];
    (this->D_dtdt).m_data[1] = (other->D_dtdt).m_data[1];
    (this->D_dtdt).m_data[2] = (other->D_dtdt).m_data[2];
  }
  return;
}

Assistant:

ChNodeFEAxyzD::ChNodeFEAxyzD(const ChNodeFEAxyzD& other) : ChNodeFEAxyz(other) {
    variables_D = new ChVariablesGenericDiagonalMass(3);
    (*variables_D) = (*other.variables_D);
    D = other.D;
    D_dt = other.D_dt;
    D_dtdt = other.D_dtdt;
}